

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O2

SUNErrCode SUNMatScaleAddI_Band(sunrealtype c,SUNMatrix A)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  
  pvVar1 = A->content;
  lVar4 = 0;
  lVar3 = *(long *)((long)pvVar1 + 8);
  if (*(long *)((long)pvVar1 + 8) < 1) {
    lVar3 = lVar4;
  }
  for (; lVar4 != lVar3; lVar4 = lVar4 + 1) {
    pdVar5 = (double *)
             (*(long *)((long)pvVar1 + 0x28) * 8 +
             *(long *)(*(long *)((long)pvVar1 + 0x40) + lVar4 * 8));
    lVar2 = *(long *)((long)pvVar1 + 0x20);
    for (lVar6 = -*(long *)((long)pvVar1 + 0x18); lVar6 <= lVar2; lVar6 = lVar6 + 1) {
      pdVar5[lVar6] = pdVar5[lVar6] * c;
    }
    *pdVar5 = *pdVar5 + 1.0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAddI_Band(sunrealtype c, SUNMatrix A)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;
  sunrealtype* A_colj;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);

  /* Perform operation */
  for (j = 0; j < SM_COLUMNS_B(A); j++)
  {
    A_colj = SM_COLUMN_B(A, j);
    for (i = -SM_UBAND_B(A); i <= SM_LBAND_B(A); i++) { A_colj[i] *= c; }
    SM_ELEMENT_B(A, j, j) += ONE;
  }
  return SUN_SUCCESS;
}